

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O2

Link * Link::factory(int type_,string *name_,MemPool *memPool)

{
  Pump *this;
  string *name__00;
  string local_80;
  string local_60;
  string local_40;
  
  if (type_ == 2) {
    this = (Pump *)MemPool::alloc(memPool,0xb8);
    name__00 = &local_40;
    std::__cxx11::string::string((string *)name__00,(string *)name_);
    Valve::Valve((Valve *)this,name__00);
  }
  else if (type_ == 1) {
    this = (Pump *)MemPool::alloc(memPool,0x148);
    name__00 = &local_60;
    std::__cxx11::string::string((string *)name__00,(string *)name_);
    Pump::Pump(this,name__00);
  }
  else {
    if (type_ != 0) {
      return (Link *)0x0;
    }
    this = (Pump *)MemPool::alloc(memPool,0xe8);
    name__00 = &local_80;
    std::__cxx11::string::string((string *)name__00,(string *)name_);
    Pipe::Pipe((Pipe *)this,name__00);
  }
  std::__cxx11::string::~string((string *)name__00);
  return &this->super_Link;
}

Assistant:

Link* Link::factory(int type_, string name_, MemPool* memPool)
{
    switch (type_)
    {
    case PIPE:
        return new(memPool->alloc(sizeof(Pipe))) Pipe(name_);
        break;
    case PUMP:
        return new(memPool->alloc(sizeof(Pump))) Pump(name_);
        break;
    case VALVE:
        return new(memPool->alloc(sizeof(Valve))) Valve(name_);
        break;
    default:
        return nullptr;
    }
}